

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_bool32 ma_dr_flac_oggbs__seek_physical
                    (ma_dr_flac_oggbs *oggbs,ma_uint64 offset,ma_dr_flac_seek_origin origin)

{
  ma_bool32 mVar1;
  ma_bool32 mVar2;
  
  if (origin == ma_dr_flac_seek_origin_start) {
    if ((offset & 0xffffffff80000000) == 0) {
      mVar1 = (*oggbs->onSeek)(oggbs->pUserData,(int)offset,ma_dr_flac_seek_origin_start);
      if (mVar1 == 0) {
        return 0;
      }
      oggbs->currentBytePos = offset;
      return 1;
    }
    mVar1 = (*oggbs->onSeek)(oggbs->pUserData,0x7fffffff,ma_dr_flac_seek_origin_start);
    if (mVar1 == 0) {
      return 0;
    }
    oggbs->currentBytePos = offset;
    offset = offset - 0x7fffffff;
  }
  if (offset >> 0x1f != 0) {
    do {
      mVar1 = (*oggbs->onSeek)(oggbs->pUserData,0x7fffffff,ma_dr_flac_seek_origin_current);
      if (mVar1 == 0) goto LAB_00167737;
      oggbs->currentBytePos = oggbs->currentBytePos + 0x7fffffff;
      offset = offset - 0x7fffffff;
    } while (0x7fffffff < offset);
  }
  mVar2 = 1;
  mVar1 = (*oggbs->onSeek)(oggbs->pUserData,(int)offset,ma_dr_flac_seek_origin_current);
  if (mVar1 == 0) {
LAB_00167737:
    mVar2 = 0;
  }
  else {
    oggbs->currentBytePos = oggbs->currentBytePos + offset;
  }
  return mVar2;
}

Assistant:

static ma_bool32 ma_dr_flac_oggbs__seek_physical(ma_dr_flac_oggbs* oggbs, ma_uint64 offset, ma_dr_flac_seek_origin origin)
{
    if (origin == ma_dr_flac_seek_origin_start) {
        if (offset <= 0x7FFFFFFF) {
            if (!oggbs->onSeek(oggbs->pUserData, (int)offset, ma_dr_flac_seek_origin_start)) {
                return MA_FALSE;
            }
            oggbs->currentBytePos = offset;
            return MA_TRUE;
        } else {
            if (!oggbs->onSeek(oggbs->pUserData, 0x7FFFFFFF, ma_dr_flac_seek_origin_start)) {
                return MA_FALSE;
            }
            oggbs->currentBytePos = offset;
            return ma_dr_flac_oggbs__seek_physical(oggbs, offset - 0x7FFFFFFF, ma_dr_flac_seek_origin_current);
        }
    } else {
        while (offset > 0x7FFFFFFF) {
            if (!oggbs->onSeek(oggbs->pUserData, 0x7FFFFFFF, ma_dr_flac_seek_origin_current)) {
                return MA_FALSE;
            }
            oggbs->currentBytePos += 0x7FFFFFFF;
            offset -= 0x7FFFFFFF;
        }
        if (!oggbs->onSeek(oggbs->pUserData, (int)offset, ma_dr_flac_seek_origin_current)) {
            return MA_FALSE;
        }
        oggbs->currentBytePos += offset;
        return MA_TRUE;
    }
}